

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cc
# Opt level: O2

void __thiscall
gss::UnsupportedConfiguration::UnsupportedConfiguration
          (UnsupportedConfiguration *this,string *message)

{
  *(undefined ***)this = &PTR__UnsupportedConfiguration_001537b8;
  std::__cxx11::string::string((string *)&this->_what,message);
  return;
}

Assistant:

UnsupportedConfiguration::UnsupportedConfiguration(const string & message) noexcept :
    _what(message)
{
}